

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_options_common<char>::basic_json_options_common
          (basic_json_options_common<char> *this,basic_json_options_common<char> *param_2)

{
  long in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__basic_json_options_common_01333798;
  *(undefined2 *)(in_RDI + 1) = *(undefined2 *)(in_RSI + 8);
  std::__cxx11::string::string((string *)(in_RDI + 2),(string *)(in_RSI + 0x10));
  std::__cxx11::string::string((string *)(in_RDI + 6),(string *)(in_RSI + 0x30));
  std::__cxx11::string::string((string *)(in_RDI + 10),(string *)(in_RSI + 0x50));
  std::__cxx11::string::string((string *)(in_RDI + 0xe),(string *)(in_RSI + 0x70));
  std::__cxx11::string::string((string *)(in_RDI + 0x12),(string *)(in_RSI + 0x90));
  std::__cxx11::string::string((string *)(in_RDI + 0x16),(string *)(in_RSI + 0xb0));
  *(undefined4 *)(in_RDI + 0x1a) = *(undefined4 *)(in_RSI + 0xd0);
  return;
}

Assistant:

basic_json_options_common(const basic_json_options_common&) = default;